

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

void d68020_cas2_16(void)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint extension;
  
  if ((g_cpu_type & 0x1c) == 0) {
    if ((g_cpu_ir & 0xf000) == 0xf000) {
      d68000_1111();
    }
    else {
      d68000_illegal();
    }
  }
  else {
    uVar1 = dasm_read_imm_32(4);
    uVar2 = 0x44;
    if ((uVar1 & 0x80000000) != 0) {
      uVar2 = 0x41;
    }
    uVar3 = 0x44;
    if ((uVar1 & 0x8000) != 0) {
      uVar3 = 0x41;
    }
    sprintf(g_dasm_str,"cas2.w  D%d:D%d, D%d:D%d, (%c%d):(%c%d); (2+)",(ulong)(uVar1 >> 0x10 & 7),
            (ulong)(uVar1 & 7),(ulong)(uVar1 >> 0x16 & 7),(ulong)(uVar1 >> 6 & 7),uVar2,
            uVar1 >> 0x1c & 7,uVar3,uVar1 >> 0xc & 7);
  }
  return;
}

Assistant:

static void d68020_cas2_16(void)
{
/* CAS2 Dc1:Dc2,Du1:Dc2:(Rn1):(Rn2)
f e d c b a 9 8 7 6 5 4 3 2 1 0
 DARn1  0 0 0  Du1  0 0 0  Dc1
 DARn2  0 0 0  Du2  0 0 0  Dc2
*/

	uint extension;
	LIMIT_CPU_TYPES(M68020_PLUS);
	extension = read_imm_32();
	sprintf(g_dasm_str, "cas2.w  D%d:D%d, D%d:D%d, (%c%d):(%c%d); (2+)",
		(extension>>16)&7, extension&7, (extension>>22)&7, (extension>>6)&7,
		BIT_1F(extension) ? 'A' : 'D', (extension>>28)&7,
		BIT_F(extension) ? 'A' : 'D', (extension>>12)&7);
}